

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_generic.h
# Opt level: O3

void m256v_LU_invmult(m256v *LU,int rank,int *rowperm,int *colperm,m256v *Y,m256v *X_out)

{
  int iVar1;
  bool bVar2;
  uint8_t alpha;
  long lVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  
  if (rank == -1) {
    rank = LU->n_row;
    if (LU->n_col < LU->n_row) {
      rank = LU->n_col;
    }
  }
  iVar5 = X_out->n_row;
  if (rank < iVar5) {
    lVar3 = (long)rank;
    uVar4 = (ulong)(uint)X_out->n_col;
    do {
      if (0 < (int)uVar4) {
        iVar5 = colperm[lVar3];
        lVar7 = 0;
        do {
          X_out->e[lVar7 + X_out->rstride * (long)iVar5] = '\0';
          lVar7 = lVar7 + 1;
          uVar4 = (ulong)X_out->n_col;
        } while (lVar7 < (long)uVar4);
        iVar5 = X_out->n_row;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < iVar5);
  }
  if (0 < rank) {
    uVar4 = (ulong)(uint)rank;
    uVar6 = 0;
    do {
      if (0 < X_out->n_col) {
        iVar5 = colperm[uVar6];
        iVar1 = rowperm[uVar6];
        lVar3 = 0;
        do {
          X_out->e[lVar3 + X_out->rstride * (long)iVar5] = Y->e[lVar3 + Y->rstride * (long)iVar1];
          lVar3 = lVar3 + 1;
        } while (lVar3 < X_out->n_col);
      }
      if (uVar6 != 0) {
        uVar8 = 0;
        do {
          m256v_multadd_row_from
                    (X_out,colperm[uVar8],0,LU->e[uVar8 + LU->rstride * uVar6],X_out,colperm[uVar6])
          ;
          uVar8 = uVar8 + 1;
        } while (uVar6 != uVar8);
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != uVar4);
    uVar6 = uVar4;
    if (0 < rank) {
      do {
        uVar9 = uVar4 - 1;
        uVar8 = uVar4;
        if ((long)uVar4 < (long)LU->n_col) {
          do {
            m256v_multadd_row_from
                      (X_out,colperm[uVar8],0,LU->e[uVar8 + LU->rstride * (uVar6 - 1)],X_out,
                       colperm[uVar9]);
            uVar8 = uVar8 + 1;
          } while ((long)uVar8 < (long)LU->n_col);
        }
        iVar5 = colperm[uVar9];
        alpha = gf256_inv(LU->e[(uVar4 - 1) + LU->rstride * uVar9]);
        m256v_mult_row(X_out,iVar5,alpha);
        bVar2 = 1 < (long)uVar4;
        uVar4 = uVar9;
        uVar6 = uVar6 - 1;
      } while (bVar2);
    }
  }
  return;
}

Assistant:

void MV_GEN_N(_LU_invmult)(const MV_GEN_TYPE* LU,
			int rank,
			const int* rowperm,
			const int* colperm,
			const MV_GEN_TYPE* Y,
			MV_GEN_TYPE* X_out)
{
	/* Check dimensions */
	assert(LU->n_col == X_out->n_row);
	assert(LU->n_row == Y->n_row);
	assert(X_out->n_col == Y->n_col);

	/* If the rank is unspecified (-1), we assume the max rank */
	if (rank == -1)
		rank = (LU->n_col < LU->n_row ? LU->n_col : LU->n_row);

	/* Clear out the unused rows in the target vector */
	for (int i = rank; i < X_out->n_row; ++i) {
		MV_GEN_N(_clear_row)(X_out, colperm[i]);
	}

	/* Multiply with L^-1 */
	for (int i = 0; i < rank; ++i) {
		MV_GEN_N(_copy_row)(Y, rowperm[i], X_out, colperm[i]);
		for (int j = 0; j < i; ++j) {
			MV_GEN_N(_multadd_row)(X_out, colperm[j],
					MV_GEN_N(_get_el)(LU, i, j),
					X_out, colperm[i]);
		}
	}

	/* Multiply with U^-1 */
	for (int i = rank - 1; i >= 0; --i) {
		for (int j = i + 1; j < LU->n_col; ++j) {
			MV_GEN_N(_multadd_row)(X_out, colperm[j],
			  MV_GEN_N(_get_el)(LU, i, j), X_out, colperm[i]);
		}
		MV_GEN_N(_mult_row)(X_out, colperm[i],
				finv(MV_GEN_N(_get_el)(LU, i, i)));
	}
}